

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void prvTidyParseList(TidyDocImpl *doc,Node *list,GetTokenMode mode)

{
  uint uVar1;
  Lexer *pLVar2;
  Dict *pDVar3;
  Bool BVar4;
  Node *pNVar5;
  ulong uVar6;
  ulong uVar7;
  Node *pNVar8;
  Node *pNVar9;
  Node **ppNVar10;
  char *property;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  
  if ((list == (Node *)0x0) || (list->tag == (Dict *)0x0)) {
    bVar12 = false;
  }
  else {
    bVar12 = list->tag->id == TidyTag_OL;
  }
  if ((list->tag->model & 1) != 0) {
    return;
  }
  pLVar2 = doc->lexer;
  pLVar2->insert = (IStack *)0x0;
  pNVar5 = prvTidyGetToken(doc,IgnoreWhitespace);
  if (pNVar5 != (Node *)0x0) {
    do {
      if ((pNVar5->tag == list->tag) && (pNVar5->type == EndTag)) {
        prvTidyFreeNode(doc,pNVar5);
        list->closed = yes;
LAB_0013ecdd:
        bVar13 = true;
      }
      else {
        BVar4 = InsertMisc(list,pNVar5);
        bVar13 = false;
        if (BVar4 == no) {
          if ((pNVar5->type == TextNode) || (pNVar5->tag != (Dict *)0x0)) {
            if (pLVar2 != (Lexer *)0x0 && pNVar5->type == TextNode) {
              uVar1 = pNVar5->end;
              bVar11 = pNVar5->start < uVar1;
              if (bVar11) {
                uVar7 = (ulong)pNVar5->start;
                do {
                  uVar6 = uVar7 + 1;
                  if ((0x20 < (ulong)(byte)pLVar2->lexbuf[uVar7]) ||
                     ((0x100002600U >> ((ulong)(byte)pLVar2->lexbuf[uVar7] & 0x3f) & 1) == 0)) {
                    if (bVar11) goto LAB_0013ed8b;
                    break;
                  }
                  bVar11 = uVar6 < uVar1;
                  uVar7 = uVar6;
                } while (uVar6 != uVar1);
              }
              prvTidyFreeNode(doc,pNVar5);
LAB_0013ed8b:
              bVar13 = false;
              if (!bVar11) goto LAB_0013f051;
            }
            pDVar3 = pNVar5->tag;
            if (pNVar5->type != EndTag) {
              if (pDVar3 == (Dict *)0x0) {
                if (bVar12) goto LAB_0013ee7d;
LAB_0013eeb0:
                bVar13 = false;
              }
              else {
                if (!(bool)(bVar12 & pDVar3->id != TidyTag_LI)) goto LAB_0013eeb0;
LAB_0013ee7d:
                pNVar9 = list->content;
                if (pNVar9 == (Node *)0x0) goto LAB_0013eeb0;
                pNVar8 = (Node *)0x0;
                do {
                  if (((pNVar9->tag != (Dict *)0x0) && (pNVar9->tag->id == TidyTag_LI)) &&
                     (pNVar9->type == StartTag)) {
                    pNVar8 = pNVar9;
                  }
                  pNVar9 = pNVar9->next;
                } while (pNVar9 != (Node *)0x0);
                bVar13 = pNVar8 != (Node *)0x0;
              }
              pNVar9 = pNVar5;
              if (((pDVar3 == (Dict *)0x0) || (pDVar3->id != TidyTag_LI)) &&
                 (BVar4 = prvTidyIsHTML5Mode(doc), BVar4 == no || bVar13)) {
                prvTidyUngetToken(doc);
                BVar4 = prvTidynodeHasCM(pNVar5,8);
                if ((BVar4 != no) && (pLVar2->excludeBlocks != no)) {
                  prvTidyReport(doc,list,pNVar5,0x259);
                  goto LAB_0013ecdd;
                }
                if (pLVar2->exiled != no) {
                  BVar4 = prvTidynodeHasCM(pNVar5,0x380);
                  bVar13 = true;
                  if ((BVar4 != no) ||
                     ((pNVar5->tag != (Dict *)0x0 && (pNVar5->tag->id == TidyTag_TABLE))))
                  goto LAB_0013f051;
                }
                if ((list == (Node *)0x0) ||
                   ((list->tag == (Dict *)0x0 || (list->tag->id != TidyTag_OL)))) {
LAB_0013efd0:
                  BVar4 = prvTidynodeHasCM(pNVar5,8);
                  pNVar9 = prvTidyInferredTag(doc,TidyTag_LI);
                  property = "list-style: none; display: inline";
                  if (BVar4 == no) {
                    property = "list-style: none";
                  }
                  prvTidyAddStyleProperty(doc,pNVar9,property);
                  prvTidyReport(doc,list,pNVar9,0x261);
                  goto LAB_0013f023;
                }
                pNVar9 = (Node *)0x0;
                for (pNVar8 = list->content; pNVar8 != (Node *)0x0; pNVar8 = pNVar8->next) {
                  if (((pNVar8->tag != (Dict *)0x0) && (pNVar8->tag->id == TidyTag_LI)) &&
                     (pNVar8->type == StartTag)) {
                    pNVar9 = pNVar8;
                  }
                }
                if (pNVar9 == (Node *)0x0) goto LAB_0013efd0;
                pNVar5 = prvTidyInferredTag(doc,TidyTag_LI);
                prvTidyReport(doc,list,pNVar5,0x261);
                prvTidyFreeNode(doc,pNVar5);
              }
              else {
LAB_0013f023:
                pNVar9->parent = list;
                pNVar5 = list->last;
                pNVar9->prev = pNVar5;
                ppNVar10 = &pNVar5->next;
                if (pNVar5 == (Node *)0x0) {
                  ppNVar10 = &list->content;
                }
                *ppNVar10 = pNVar9;
                list->last = pNVar9;
              }
              bVar13 = false;
              ParseTag(doc,pNVar9,IgnoreWhitespace);
              goto LAB_0013f051;
            }
            if ((pDVar3 != (Dict *)0x0) && (pDVar3->id == TidyTag_FORM)) {
              *(byte *)&doc->badForm = (byte)doc->badForm | 1;
              goto LAB_0013edb2;
            }
            BVar4 = prvTidynodeHasCM(pNVar5,0x10);
            pNVar9 = list;
            if (BVar4 == no) {
              do {
                pNVar9 = pNVar9->parent;
                if ((pNVar9 == (Node *)0x0) ||
                   ((pDVar3 = pNVar9->tag, pDVar3 != (Dict *)0x0 && (pDVar3->id == TidyTag_BODY))))
                goto LAB_0013edb2;
              } while (pNVar5->tag != pDVar3);
              prvTidyReport(doc,list,pNVar5,0x259);
              prvTidyUngetToken(doc);
              goto LAB_0013ecdd;
            }
            prvTidyReport(doc,list,pNVar5,0x235);
            prvTidyPopInline(doc,pNVar5);
          }
          else {
LAB_0013edb2:
            prvTidyReport(doc,list,pNVar5,0x235);
          }
          prvTidyFreeNode(doc,pNVar5);
          bVar13 = false;
        }
      }
LAB_0013f051:
      if (bVar13) {
        return;
      }
      pNVar5 = prvTidyGetToken(doc,IgnoreWhitespace);
    } while (pNVar5 != (Node *)0x0);
  }
  prvTidyReport(doc,list,(Node *)0x0,0x25a);
  return;
}

Assistant:

void TY_(ParseList)(TidyDocImpl* doc, Node *list, GetTokenMode ARG_UNUSED(mode))
{
#if defined(ENABLE_DEBUG_LOG)
    static int in_parse_list = 0;
#endif
    Lexer* lexer = doc->lexer;
    Node *node, *parent, *lastli;
    Bool wasblock;
    Bool nodeisOL = nodeIsOL(list);

#if defined(ENABLE_DEBUG_LOG)
    in_parse_list++;
    SPRTF("Entering ParseList %d...\n",in_parse_list);
#endif
    if (list->tag->model & CM_EMPTY)
    {
#if defined(ENABLE_DEBUG_LOG)
        in_parse_list--;
        SPRTF("Exit ParseList 1 %d... CM_EMPTY\n",in_parse_list);
#endif
        return;
    }
    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)( doc, IgnoreWhitespace)) != NULL)
    {
        Bool foundLI = no;
        if (node->tag == list->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            list->closed = yes;
#if defined(ENABLE_DEBUG_LOG)
            in_parse_list--;
            SPRTF("Exit ParseList 2 %d... Endtag\n",in_parse_list);
#endif
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(list, node))
            continue;

        if (node->type != TextNode && node->tag == NULL)
        {
            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }
        if (lexer && (node->type == TextNode))
        {
            uint ch, ix = node->start;
            /* Issue #572 - Skip whitespace. */
            while (ix < node->end && (ch = (lexer->lexbuf[ix] & 0xff))
                && (ch == ' ' || ch == '\t' || ch == '\r' || ch == '\n'))
                ++ix;
            if (ix >= node->end)
            {
                /* Issue #572 - Discard if ALL whitespace. */
                TY_(FreeNode)(doc, node);
                continue;
            }
        }


        /* 
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node );
                continue;
            }

            if (TY_(nodeHasCM)(node,CM_INLINE))
            {
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(PopInline)( doc, node );
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = list->parent;
                  parent != NULL; parent = parent->parent )
            {
               /* Do not match across BODY to avoid infinite loop
                  between ParseBody and this parser,
                  See http://tidy.sf.net/bug/1053626. */
                if (nodeIsBODY(parent))
                    break;
                if (node->tag == parent->tag)
                {
                    TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);
                    TY_(UngetToken)( doc );
#if defined(ENABLE_DEBUG_LOG)
                    in_parse_list--;
                    SPRTF("Exit ParseList 3 %d... No End Tag\n",in_parse_list);
#endif
                    return;
                }
            }

            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( !nodeIsLI(node) && nodeisOL )
        {
            /* Issue #572 - A <ol><li> can have nested <ol> elements */
            foundLI = FindLastLI(list, &lastli); /* find last <li> */
        }

        if ( nodeIsLI(node) || (TY_(IsHTML5Mode)(doc) && !foundLI) )
        {
            /* node is <LI> OR
               Issue #396 - A <ul> can have Zero or more <li> elements
             */
            TY_(InsertNodeAtEnd)(list,node);
        }
        else
        {
            TY_(UngetToken)( doc );

            if (TY_(nodeHasCM)(node,CM_BLOCK) && lexer->excludeBlocks)
            {
                TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);
#if defined(ENABLE_DEBUG_LOG)
                in_parse_list--;
                SPRTF("Exit ParseList 4 %d... No End Tag\n",in_parse_list);
#endif
                return;
            }
            /* http://tidy.sf.net/issue/1316307 */
            /* In exiled mode, return so table processing can continue. */
            else if ( lexer->exiled
                      && (TY_(nodeHasCM)(node, CM_TABLE|CM_ROWGRP|CM_ROW)
                          || nodeIsTABLE(node)) )
            {
#if defined(ENABLE_DEBUG_LOG)
                in_parse_list--;
                SPRTF("Exit ParseList 5 %d... exiled\n",in_parse_list);
#endif
                return;
            }
            /* http://tidy.sf.net/issue/836462
               If "list" is an unordered list, insert the next tag within 
               the last <li> to preserve the numbering to match the visual 
               rendering of most browsers. */    
            if ( nodeIsOL(list) && FindLastLI(list, &lastli) )
            {
                /* Create a node for error reporting */
                node = TY_(InferredTag)(doc, TidyTag_LI);
                TY_(Report)(doc, list, node, MISSING_STARTTAG );
                TY_(FreeNode)( doc, node);
                node = lastli;
            }
            else
            {
                /* Add an inferred <li> */
                wasblock = TY_(nodeHasCM)(node,CM_BLOCK);
                node = TY_(InferredTag)(doc, TidyTag_LI);
                /* Add "display: inline" to avoid a blank line after <li> with 
                   Internet Explorer. See http://tidy.sf.net/issue/836462 */
                TY_(AddStyleProperty)( doc, node,
                                       wasblock
                                       ? "list-style: none; display: inline"
                                       : "list-style: none" 
                                       );
                TY_(Report)(doc, list, node, MISSING_STARTTAG );
                TY_(InsertNodeAtEnd)(list,node);
            }
        }

        ParseTag( doc, node, IgnoreWhitespace);
    }

    TY_(Report)(doc, list, node, MISSING_ENDTAG_FOR);
#if defined(ENABLE_DEBUG_LOG)
    in_parse_list--;
    SPRTF("Exit ParseList 6 %d... missing end tag\n",in_parse_list);
#endif
}